

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkSparsifyInternal(Abc_Ntk_t *pNtk,int nPerc,int fVerbose)

{
  DdManager *dd;
  int iVar1;
  Abc_Ntk_t *pNtkNew_00;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  DdNode *bFunc_00;
  DdNode *n;
  char *pSuffix;
  Abc_Obj_t *local_d0;
  Abc_Obj_t *local_b8;
  int local_5c;
  int local_58;
  int c;
  int k;
  int i;
  DdManager *ddNew;
  DdNode *bFuncOld;
  DdNode *bFunc;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  int fVerbose_local;
  int nPerc_local;
  Abc_Ntk_t *pNtk_local;
  
  pNtkNew_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_BDD,1);
  for (c = 0; iVar1 = Abc_NtkCiNum(pNtk), c < iVar1; c = c + 1) {
    pAVar2 = Abc_NtkCi(pNtk,c);
    Abc_NtkDupObj(pNtkNew_00,pAVar2,1);
  }
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtkNew_00->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pNtkNew_00->pSpec = pcVar3;
  dd = (DdManager *)pNtkNew_00->pManFunc;
  iVar1 = Abc_NtkCiNum(pNtk);
  Cudd_bddIthVar(dd,iVar1 + -1);
  c = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= c) {
      Abc_NtkLogicMakeSimpleCos(pNtkNew_00,0);
      return pNtkNew_00;
    }
    pAVar2 = Abc_NtkCo(pNtk,c);
    pAVar4 = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_ObjIsCi(pAVar4);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjFaninNum(pAVar4);
      if (iVar1 == 0) {
        Abc_NtkDupObj(pNtkNew_00,pAVar2,0);
        pAVar4 = (pAVar2->field_6).pCopy;
        iVar1 = Abc_ObjFaninC0(pAVar2);
        if (iVar1 == 0) {
          local_b8 = Abc_NtkCreateNodeConst1(pNtkNew_00);
        }
        else {
          local_b8 = Abc_NtkCreateNodeConst0(pNtkNew_00);
        }
        Abc_ObjAddFanin(pAVar4,local_b8);
        pAVar4 = (pAVar2->field_6).pCopy;
        pcVar3 = Abc_ObjName(pAVar2);
        Abc_ObjAssignName(pAVar4,pcVar3,"_on");
        Abc_NtkDupObj(pNtkNew_00,pAVar2,0);
        pAVar4 = (pAVar2->field_6).pCopy;
        iVar1 = Abc_ObjFaninC0(pAVar2);
        if (iVar1 == 0) {
          local_d0 = Abc_NtkCreateNodeConst0(pNtkNew_00);
        }
        else {
          local_d0 = Abc_NtkCreateNodeConst1(pNtkNew_00);
        }
        Abc_ObjAddFanin(pAVar4,local_d0);
        pAVar4 = (pAVar2->field_6).pCopy;
        pcVar3 = Abc_ObjName(pAVar2);
        Abc_ObjAssignName(pAVar4,pcVar3,"_off");
      }
      else {
        iVar1 = Abc_ObjFaninNum(pAVar2);
        if (iVar1 < 1) {
          __assert_fail("Abc_ObjFaninNum(pObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDsd.c"
                        ,0x293,"Abc_Ntk_t *Abc_NtkSparsifyInternal(Abc_Ntk_t *, int, int)");
        }
        for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
          Cudd_Srandom(0);
          Abc_NtkDupObj(pNtkNew_00,pAVar4,0);
          for (local_58 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_58 < iVar1;
              local_58 = local_58 + 1) {
            pAVar6 = Abc_ObjFanin(pAVar4,local_58);
            Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar6->field_6).pCopy);
          }
          bFunc_00 = (DdNode *)((ulong)(((pAVar4->field_6).pCopy)->field_5).pData ^ (long)local_5c);
          iVar1 = Abc_ObjFaninNum(pAVar4);
          n = Abc_NtkSparsifyInternalOne(dd,bFunc_00,iVar1,nPerc);
          Cudd_Ref(n);
          Cudd_RecursiveDeref(dd,bFunc_00);
          (((pAVar4->field_6).pCopy)->field_5).pData = n;
          Abc_NtkDupObj(pNtkNew_00,pAVar2,0);
          Abc_ObjAddFanin((pAVar2->field_6).pCopy,(pAVar4->field_6).pCopy);
          pAVar6 = (pAVar2->field_6).pCopy;
          pcVar3 = Abc_ObjName(pAVar2);
          pSuffix = "_on";
          if (local_5c != 0) {
            pSuffix = "_off";
          }
          Abc_ObjAssignName(pAVar6,pcVar3,pSuffix);
        }
      }
    }
    else {
      Abc_NtkDupObj(pNtkNew_00,pAVar2,0);
      pAVar6 = (pAVar2->field_6).pCopy;
      pAVar5 = (pAVar4->field_6).pCopy;
      iVar1 = Abc_ObjFaninC0(pAVar2);
      pAVar5 = Abc_ObjNotCond(pAVar5,iVar1);
      Abc_ObjAddFanin(pAVar6,pAVar5);
      pAVar6 = (pAVar2->field_6).pCopy;
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_ObjAssignName(pAVar6,pcVar3,"_on");
      Abc_NtkDupObj(pNtkNew_00,pAVar2,0);
      pAVar6 = (pAVar2->field_6).pCopy;
      pAVar4 = (pAVar4->field_6).pCopy;
      iVar1 = Abc_ObjFaninC0(pAVar2);
      pAVar4 = Abc_ObjNotCond(pAVar4,(uint)((iVar1 != 0 ^ 0xffU) & 1));
      Abc_ObjAddFanin(pAVar6,pAVar4);
      pAVar4 = (pAVar2->field_6).pCopy;
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_ObjAssignName(pAVar4,pcVar3,"_off");
    }
    c = c + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkSparsifyInternal( Abc_Ntk_t * pNtk, int nPerc, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pDriver, * pFanin;
    DdNode * bFunc, * bFuncOld;
    DdManager * ddNew;
    int i, k, c;
    // start the new network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_BDD, 1 );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // make sure the new manager has enough inputs
    ddNew = (DdManager *)pNtkNew->pManFunc;
    Cudd_bddIthVar( ddNew, Abc_NtkCiNum(pNtk)-1 );
    // go through the outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0( pObj );
        if ( Abc_ObjIsCi(pDriver) )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjNotCond(pDriver->pCopy, Abc_ObjFaninC0(pObj)) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_on" );

            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjNotCond(pDriver->pCopy, !Abc_ObjFaninC0(pObj)) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_off" );
            continue;
        }
        if ( Abc_ObjFaninNum(pDriver) == 0 )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFaninC0(pObj) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_on" );

            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFaninC0(pObj) ? Abc_NtkCreateNodeConst1(pNtkNew) : Abc_NtkCreateNodeConst0(pNtkNew) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_off" );
            continue;
        }
        assert( Abc_ObjFaninNum(pObj) > 0 );
        // onset/offset
        for ( c = 0; c < 2; c++ )
        {
            Cudd_Srandom( 0 );
            Abc_NtkDupObj( pNtkNew, pDriver, 0 );
            Abc_ObjForEachFanin( pDriver, pFanin, k )
                Abc_ObjAddFanin( pDriver->pCopy, pFanin->pCopy );
            bFuncOld = Cudd_NotCond( (DdNode *)pDriver->pCopy->pData, c );
            bFunc = Abc_NtkSparsifyInternalOne( ddNew, bFuncOld, Abc_ObjFaninNum(pDriver), nPerc );  Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( ddNew, bFuncOld );
            pDriver->pCopy->pData = bFunc;
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), (char*)(c ? "_off" : "_on") );
        }
    }
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    return pNtkNew;
}